

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O3

void tif_14uto32s(OPJ_BYTE *pSrc,OPJ_INT32 *pDst,OPJ_SIZE_T length)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  ulong uVar8;
  int iVar9;
  
  uVar8 = 0;
  if ((length & 0xfffffffffffffffc) != 0) {
    do {
      bVar1 = *pSrc;
      bVar2 = pSrc[1];
      bVar3 = pSrc[2];
      bVar4 = pSrc[3];
      bVar5 = pSrc[4];
      bVar6 = pSrc[5];
      bVar7 = pSrc[6];
      pSrc = pSrc + 7;
      pDst[uVar8] = (uint)(bVar2 >> 2) | (uint)bVar1 << 6;
      pDst[uVar8 + 1] = (uint)(bVar4 >> 4) | (uint)bVar3 << 4 | (bVar2 & 3) << 0xc;
      pDst[uVar8 + 2] = (uint)(bVar6 >> 6) | (bVar4 & 0xf) * 0x400 + (uint)bVar5 * 4;
      pDst[uVar8 + 3] = (bVar6 & 0x3f) << 8 | (uint)bVar7;
      uVar8 = uVar8 + 4;
    } while (uVar8 < (length & 0xfffffffffffffffc));
  }
  if ((length & 3) != 0) {
    bVar1 = pSrc[1];
    pDst[uVar8] = (uint)(bVar1 >> 2) | (uint)*pSrc << 6;
    iVar9 = (int)(length & 3);
    if (iVar9 != 1) {
      bVar2 = pSrc[3];
      pDst[uVar8 + 1] = (uint)(bVar2 >> 4) | (uint)pSrc[2] << 4 | (bVar1 & 3) << 0xc;
      if (iVar9 == 3) {
        pDst[uVar8 + 2] = (uint)(pSrc[5] >> 6) | (bVar2 & 0xf) * 0x400 + (uint)pSrc[4] * 4;
      }
    }
  }
  return;
}

Assistant:

static void tif_14uto32s(const OPJ_BYTE* pSrc, OPJ_INT32* pDst,
                         OPJ_SIZE_T length)
{
    OPJ_SIZE_T i;
    for (i = 0; i < (length & ~(OPJ_SIZE_T)3U); i += 4U) {
        OPJ_UINT32 val0 = *pSrc++;
        OPJ_UINT32 val1 = *pSrc++;
        OPJ_UINT32 val2 = *pSrc++;
        OPJ_UINT32 val3 = *pSrc++;
        OPJ_UINT32 val4 = *pSrc++;
        OPJ_UINT32 val5 = *pSrc++;
        OPJ_UINT32 val6 = *pSrc++;

        pDst[i + 0] = (OPJ_INT32)((val0 << 6) | (val1 >> 2));
        pDst[i + 1] = (OPJ_INT32)(((val1 & 0x3U) << 12) | (val2 << 4) | (val3 >> 4));
        pDst[i + 2] = (OPJ_INT32)(((val3 & 0xFU) << 10) | (val4 << 2) | (val5 >> 6));
        pDst[i + 3] = (OPJ_INT32)(((val5 & 0x3FU) << 8) | val6);

    }
    if (length & 3U) {
        OPJ_UINT32 val0 = *pSrc++;
        OPJ_UINT32 val1 = *pSrc++;
        length = length & 3U;
        pDst[i + 0] = (OPJ_INT32)((val0 << 6) | (val1 >> 2));

        if (length > 1U) {
            OPJ_UINT32 val2 = *pSrc++;
            OPJ_UINT32 val3 = *pSrc++;
            pDst[i + 1] = (OPJ_INT32)(((val1 & 0x3U) << 12) | (val2 << 4) | (val3 >> 4));
            if (length > 2U) {
                OPJ_UINT32 val4 = *pSrc++;
                OPJ_UINT32 val5 = *pSrc++;
                pDst[i + 2] = (OPJ_INT32)(((val3 & 0xFU) << 10) | (val4 << 2) | (val5 >> 6));
            }
        }
    }
}